

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3GetInt32(char *zNum,int *pValue)

{
  char cVar1;
  byte *pbVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  
  cVar1 = *zNum;
  if (cVar1 == '-') {
    lVar4 = -1;
    zNum = zNum + 1;
  }
  else {
    if (cVar1 == '0') {
      if (((byte)(zNum[1] | 0x20U) == 0x78) && ((""[(byte)zNum[2]] & 8) != 0)) {
        pbVar2 = (byte *)(zNum + 2);
        do {
          pbVar6 = pbVar2;
          pbVar2 = pbVar6 + 1;
        } while (*pbVar6 == 0x30);
        uVar3 = (ulong)*pbVar6;
        bVar11 = true;
        uVar7 = 0;
        if ((""[uVar3] & 8) != 0) {
          uVar10 = 0;
          uVar7 = 0;
          do {
            uVar7 = (uint)(((char)((char)uVar3 * '\x02') >> 7 & 9U) + (char)uVar3 & 0xf) |
                    uVar7 << 4;
            uVar3 = (ulong)(pbVar6 + 1)[uVar10];
            if (6 < uVar10) break;
            uVar10 = uVar10 + 1;
          } while ((""[uVar3] & 8) != 0);
          bVar11 = (""[uVar3] & 8) == 0;
        }
        if ((int)uVar7 < 0) {
          return 0;
        }
        if (!bVar11) {
          return 0;
        }
        goto LAB_0013ecdc;
      }
    }
    else if (cVar1 == '+') {
      zNum = zNum + 1;
    }
    lVar4 = 0;
  }
  do {
    pcVar5 = zNum;
    zNum = pcVar5 + 1;
  } while (*pcVar5 == '0');
  lVar8 = 0;
  lVar9 = 0;
  do {
    if (9 < (byte)(pcVar5[lVar8] - 0x30U)) goto LAB_0013ecbb;
    lVar9 = (ulong)((byte)pcVar5[lVar8] & 0xf) + lVar9 * 10;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xb);
  lVar8 = 0xb;
LAB_0013ecbb:
  if (10 < (uint)lVar8) {
    return 0;
  }
  if (0x7fffffff < lVar4 + lVar9) {
    return 0;
  }
  uVar7 = -(uint)lVar9;
  if (cVar1 != '-') {
    uVar7 = (uint)lVar9;
  }
LAB_0013ecdc:
  *pValue = uVar7;
  return 1;
}

Assistant:

SQLITE_PRIVATE int sqlite3GetInt32(const char *zNum, int *pValue){
  sqlite_int64 v = 0;
  int i, c;
  int neg = 0;
  if( zNum[0]=='-' ){
    neg = 1;
    zNum++;
  }else if( zNum[0]=='+' ){
    zNum++;
  }
#ifndef SQLITE_OMIT_HEX_INTEGER
  else if( zNum[0]=='0'
        && (zNum[1]=='x' || zNum[1]=='X')
        && sqlite3Isxdigit(zNum[2])
  ){
    u32 u = 0;
    zNum += 2;
    while( zNum[0]=='0' ) zNum++;
    for(i=0; sqlite3Isxdigit(zNum[i]) && i<8; i++){
      u = u*16 + sqlite3HexToInt(zNum[i]);
    }
    if( (u&0x80000000)==0 && sqlite3Isxdigit(zNum[i])==0 ){
      memcpy(pValue, &u, 4);
      return 1;
    }else{
      return 0;
    }
  }
#endif
  while( zNum[0]=='0' ) zNum++;
  for(i=0; i<11 && (c = zNum[i] - '0')>=0 && c<=9; i++){
    v = v*10 + c;
  }

  /* The longest decimal representation of a 32 bit integer is 10 digits:
  **
  **             1234567890
  **     2^31 -> 2147483648
  */
  testcase( i==10 );
  if( i>10 ){
    return 0;
  }
  testcase( v-neg==2147483647 );
  if( v-neg>2147483647 ){
    return 0;
  }
  if( neg ){
    v = -v;
  }
  *pValue = (int)v;
  return 1;
}